

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_loop_stmt(gvisitor_t *self,gnode_loop_stmt_t *node)

{
  gtoken_t gVar1;
  gravity_function_t *f;
  gravity_vm *pgVar2;
  gnode_t *pgVar3;
  long *plVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t p1;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t p1_00;
  uint32_t p1_01;
  uint32_t p1_02;
  undefined8 uVar14;
  uint32_t *puVar15;
  ircode_t *piVar16;
  gravity_value_t gVar17;
  
  gVar1 = (node->base).token.type;
  if (2 < gVar1 - TOK_KEY_WHILE) {
    __assert_fail("(type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR)",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0x310,"void visit_loop_stmt(gvisitor_t *, gnode_loop_stmt_t *)");
  }
  f = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + -8 + *self->data * 8);
  if (gVar1 == TOK_KEY_FOR) {
    if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) goto LAB_0013684c;
    piVar16 = *(ircode_t **)((long)&f->field_9 + 0x50);
    uVar7 = ircode_register_push_temp_protected(piVar16);
    uVar8 = ircode_register_push_temp_protected(piVar16);
    pgVar2 = *(gravity_vm **)((long)self->data + 0x38);
    gVar17 = gravity_string_to_value((gravity_vm *)0x0,"iterate",0xffffffff);
    uVar5 = gravity_function_cpool_add(pgVar2,f,gVar17);
    pgVar2 = *(gravity_vm **)((long)self->data + 0x38);
    gVar17 = gravity_string_to_value((gravity_vm *)0x0,"next",0xffffffff);
    uVar6 = gravity_function_cpool_add(pgVar2,f,gVar17);
    pgVar3 = node->cond;
    if (pgVar3 != (gnode_t *)0x0) {
      if (pgVar3->tag == NODE_IDENTIFIER_EXPR) {
        if (pgVar3[1].token.colno != 0) {
          __assert_fail("expr->location.type == LOCATION_LOCAL",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                        ,0xed,"uint32_t node2index(gnode_t *)");
        }
        puVar15 = &pgVar3[1].token.position;
      }
      else {
        if (pgVar3->tag != NODE_VARIABLE_DECL) goto LAB_00136e2c;
        plVar4 = *(long **)&pgVar3[1].token;
        if ((plVar4 == (long *)0x0) || (*plVar4 != 1)) {
          __assert_fail("gnode_array_size(expr->decls) == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                        ,0xe5,"uint32_t node2index(gnode_t *)");
        }
        puVar15 = (uint32_t *)(*(long *)plVar4[2] + 0x6c);
      }
      uVar9 = *puVar15;
      gvisit(self,node->expr);
      uVar10 = ircode_register_pop(piVar16);
      if (uVar10 == 0xffffffff) {
        report_error(self,&node->base,"Invalid for expression.");
      }
      ircode_add(piVar16,MOVE,uVar7,uVar10,0,(node->base).token.lineno);
      uVar10 = ircode_register_push_temp_protected(piVar16);
      ircode_add(piVar16,LOADK,uVar10,(uint)uVar5,0,(node->base).token.lineno);
      ircode_add(piVar16,LOAD,uVar10,uVar7,uVar10,(node->base).token.lineno);
      p1 = ircode_register_push_temp_protected(piVar16);
      ircode_add(piVar16,LOADK,p1,(uint)uVar6,0,(node->base).token.lineno);
      ircode_add(piVar16,LOAD,p1,uVar7,p1,(node->base).token.lineno);
      uVar11 = ircode_register_push_temp(piVar16);
      ircode_add(piVar16,MOVE,uVar11,uVar10,0,(node->base).token.lineno);
      uVar12 = ircode_register_push_temp(piVar16);
      ircode_add(piVar16,MOVE,uVar12,uVar7,0,(node->base).token.lineno);
      uVar12 = ircode_register_push_temp(piVar16);
      ircode_add(piVar16,LOADK,uVar12,0x1002,0,(node->base).token.lineno);
      ircode_add(piVar16,CALL,uVar8,uVar11,2,(node->base).token.lineno);
      uVar11 = ircode_register_pop(piVar16);
      if (uVar11 == 0xffffffff) {
        uVar14 = 0x2b4;
      }
      else {
        uVar11 = ircode_register_pop(piVar16);
        if (uVar11 == 0xffffffff) {
          uVar14 = 0x2b6;
        }
        else {
          uVar11 = ircode_register_pop(piVar16);
          if (uVar11 == 0xffffffff) {
            uVar14 = 0x2b8;
          }
          else {
            uVar11 = ircode_newlabel(piVar16);
            uVar12 = ircode_newlabel(piVar16);
            uVar13 = ircode_newlabel(piVar16);
            ircode_setlabel_true(piVar16,uVar11);
            ircode_setlabel_false(piVar16,uVar12);
            ircode_setlabel_check(piVar16,uVar13);
            ircode_marklabel(piVar16,uVar11,(node->base).token.lineno);
            ircode_add(piVar16,JUMPF,uVar8,uVar12,1,(node->base).token.lineno);
            p1_00 = ircode_register_push_temp_protected(piVar16);
            ircode_add(piVar16,MOVE,p1_00,p1,0,(node->base).token.lineno);
            p1_01 = ircode_register_push_temp_protected(piVar16);
            ircode_add(piVar16,MOVE,p1_01,uVar7,0,(node->base).token.lineno);
            p1_02 = ircode_register_push_temp_protected(piVar16);
            ircode_add(piVar16,MOVE,p1_02,uVar8,0,(node->base).token.lineno);
            ircode_add(piVar16,CALL,(uint)(ushort)uVar9,p1_00,2,(node->base).token.lineno);
            gvisit(self,node->stmt);
            ircode_register_temp_unprotect(piVar16,p1_02);
            ircode_register_temp_unprotect(piVar16,p1_01);
            ircode_register_temp_unprotect(piVar16,p1_00);
            uVar9 = ircode_register_pop(piVar16);
            if (uVar9 == 0xffffffff) {
              uVar14 = 0x2d9;
            }
            else {
              uVar9 = ircode_register_pop(piVar16);
              if (uVar9 == 0xffffffff) {
                uVar14 = 0x2db;
              }
              else {
                uVar9 = ircode_register_pop(piVar16);
                if (uVar9 == 0xffffffff) {
                  uVar14 = 0x2dd;
                }
                else {
                  ircode_marklabel(piVar16,uVar13,(node->base).token.lineno);
                  uVar9 = ircode_register_push_temp(piVar16);
                  ircode_add(piVar16,MOVE,uVar9,uVar10,0,(node->base).token.lineno);
                  uVar13 = ircode_register_push_temp(piVar16);
                  ircode_add(piVar16,MOVE,uVar13,uVar7,0,(node->base).token.lineno);
                  uVar13 = ircode_register_push_temp(piVar16);
                  ircode_add(piVar16,MOVE,uVar13,uVar8,0,(node->base).token.lineno);
                  ircode_add(piVar16,CALL,uVar8,uVar9,2,(node->base).token.lineno);
                  uVar9 = ircode_register_pop(piVar16);
                  if (uVar9 == 0xffffffff) {
                    uVar14 = 0x2ea;
                  }
                  else {
                    uVar9 = ircode_register_pop(piVar16);
                    if (uVar9 == 0xffffffff) {
                      uVar14 = 0x2ec;
                    }
                    else {
                      uVar9 = ircode_register_pop(piVar16);
                      if (uVar9 == 0xffffffff) {
                        uVar14 = 0x2ee;
                      }
                      else {
                        ircode_add(piVar16,JUMP,uVar11,0,0,(node->base).token.lineno);
                        ircode_marklabel(piVar16,uVar12,(node->base).token.lineno);
                        ircode_unsetlabel_true(piVar16);
                        ircode_unsetlabel_false(piVar16);
                        ircode_unsetlabel_check(piVar16);
                        uVar9 = ircode_register_pop(piVar16);
                        if (uVar9 == 0xffffffff) {
                          uVar14 = 0x2f9;
                        }
                        else {
                          uVar9 = ircode_register_pop(piVar16);
                          if (uVar9 == 0xffffffff) {
                            uVar14 = 0x2fb;
                          }
                          else {
                            uVar9 = ircode_register_pop(piVar16);
                            if (uVar9 == 0xffffffff) {
                              uVar14 = 0x2fd;
                            }
                            else {
                              uVar9 = ircode_register_pop(piVar16);
                              if (uVar9 != 0xffffffff) {
                                ircode_register_temp_unprotect(piVar16,uVar7);
                                ircode_register_temp_unprotect(piVar16,uVar8);
                                ircode_register_temp_unprotect(piVar16,uVar10);
                                ircode_register_temp_unprotect(piVar16,p1);
                                if (node->nclose != 0xffffffff) {
                                  ircode_add(piVar16,CLOSE,node->nclose,0,0,
                                             (node->base).token.lineno);
                                  return;
                                }
                                return;
                              }
                              uVar14 = 0x2ff;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      fprintf(_stderr,"[%s:%d] Assert failed in %s(): %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
              ,uVar14,"visit_loop_for_stmt","Unexpected register error.");
      abort();
    }
LAB_00136e2c:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                  ,0xf2,"uint32_t node2index(gnode_t *)");
  }
  if (gVar1 == TOK_KEY_REPEAT) {
    if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) {
LAB_0013684c:
      report_error(self,&node->base,"Invalid code context.");
      return;
    }
    piVar16 = *(ircode_t **)((long)&f->field_9 + 0x50);
    uVar7 = ircode_newlabel(piVar16);
    uVar8 = ircode_newlabel(piVar16);
    uVar9 = ircode_newlabel(piVar16);
    ircode_setlabel_true(piVar16,uVar7);
    ircode_setlabel_false(piVar16,uVar8);
    ircode_setlabel_check(piVar16,uVar9);
    ircode_marklabel(piVar16,uVar7,(node->base).token.lineno);
    ircode_marklabel(piVar16,uVar9,(node->base).token.lineno);
    gvisit(self,node->stmt);
    gvisit(self,node->expr);
    uVar9 = ircode_register_pop(piVar16);
    if (uVar9 == 0xffffffff) {
      report_error(self,&node->base,"Invalid repeat condition expression.");
    }
    ircode_add(piVar16,JUMPF,uVar9,uVar8,0,(node->base).token.lineno);
  }
  else {
    if ((f == (gravity_function_t *)0x0) || (f->isa != gravity_class_function)) goto LAB_0013684c;
    piVar16 = *(ircode_t **)((long)&f->field_9 + 0x50);
    uVar7 = ircode_newlabel(piVar16);
    uVar8 = ircode_newlabel(piVar16);
    uVar9 = ircode_newlabel(piVar16);
    ircode_setlabel_true(piVar16,uVar7);
    ircode_setlabel_false(piVar16,uVar8);
    ircode_setlabel_check(piVar16,uVar9);
    ircode_marklabel(piVar16,uVar7,(node->base).token.lineno);
    ircode_marklabel(piVar16,uVar9,(node->base).token.lineno);
    gvisit(self,node->cond);
    uVar9 = ircode_register_pop(piVar16);
    if (uVar9 == 0xffffffff) {
      report_error(self,&node->base,"Invalid while condition expression.");
    }
    ircode_add(piVar16,JUMPF,uVar9,uVar8,0,(node->base).token.lineno);
    gvisit(self,node->stmt);
  }
  ircode_add(piVar16,JUMP,uVar7,0,0,(node->base).token.lineno);
  ircode_marklabel(piVar16,uVar8,(node->base).token.lineno);
  ircode_unsetlabel_true(piVar16);
  ircode_unsetlabel_false(piVar16);
  ircode_unsetlabel_check(piVar16);
  return;
}

Assistant:

static void visit_loop_stmt (gvisitor_t *self, gnode_loop_stmt_t *node) {
    DEBUG_CODEGEN("visit_loop_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR));

    if (type == TOK_KEY_WHILE) {
        visit_loop_while_stmt(self, node);
    } else if (type == TOK_KEY_REPEAT) {
        visit_loop_repeat_stmt(self, node);
    } else if (type == TOK_KEY_FOR) {
        visit_loop_for_stmt(self, node);
    }
}